

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

void cfd::capi::CheckEmptyString(char *parameter,char *name,CfdSourceLocation *location)

{
  bool bVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  char *in_stack_ffffffffffffff58;
  CfdSourceLocation *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff74;
  CfdError in_stack_ffffffffffffff7c;
  CfdException *in_stack_ffffffffffffff80;
  string local_78 [104];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  bVar1 = IsEmptyString(in_RDI);
  if ((bVar1) &&
     (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    core::logger::warn<char_const*&>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(char **)0x5a36f0);
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff70);
    uVar2 = __cxa_allocate_exception(0x30);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff87;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,(char *)local_10,(allocator *)__lhs);
    std::operator+((char *)__lhs,local_10);
    std::operator+(__lhs,(char *)local_10);
    core::CfdException::CfdException
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               (string *)CONCAT44(in_stack_ffffffffffffff74,uVar3));
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  return;
}

Assistant:

void CheckEmptyString(
    const char* parameter, const char* name,
    const cfd::core::logger::CfdSourceLocation& location) {
  if (IsEmptyString(parameter) && (name != nullptr)) {
    warn(location, "{} is null or empty.", name);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to parameter. " + std::string(name) + " is null or empty.");
  }
}